

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O1

REF_STATUS ref_list_inspect(REF_LIST ref_list)

{
  ulong uVar1;
  REF_STATUS RVar2;
  
  if (ref_list == (REF_LIST)0x0) {
    RVar2 = 2;
  }
  else {
    RVar2 = 0;
    printf("list has %d items\n",(ulong)(uint)ref_list->n);
    if (0 < ref_list->n) {
      RVar2 = 0;
      uVar1 = 0;
      do {
        printf("value[%d] = %d\n",uVar1 & 0xffffffff,(ulong)(uint)ref_list->value[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((long)uVar1 < (long)ref_list->n);
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_list_inspect(REF_LIST ref_list) {
  REF_INT i;

  if (NULL == (void *)ref_list) return REF_NULL;

  printf("list has %d items\n", ref_list_n(ref_list));
  for (i = 0; i < ref_list_n(ref_list); i++)
    printf("value[%d] = %d\n", i, ref_list->value[i]);

  return REF_SUCCESS;
}